

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Point3f __thiscall pbrt::ShapeSampleContext::OffsetRayOrigin(ShapeSampleContext *this,Vector3f *w)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  float *pfVar2;
  long in_RDI;
  Tuple3<pbrt::Normal3,_float> *t;
  type tVar3;
  float fVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Normal3<float> NVar11;
  Vector3f VVar12;
  Vector3<float> VVar13;
  Point3<float> PVar14;
  int i;
  Vector3f offset;
  Float d;
  Point3f po;
  Normal3<float> *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Point3<pbrt::Interval<float>_> *p;
  undefined4 in_stack_ffffffffffffff08;
  Point3fi *in_stack_ffffffffffffff10;
  int local_cc;
  undefined1 local_b4 [20];
  float local_a0;
  Tuple3<pbrt::Vector3,_float> local_94;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [12];
  Tuple3<pbrt::Vector3,_float> local_6c;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  type local_24;
  Tuple3<pbrt::Point3,_float> local_c;
  
  auVar10 = in_ZMM0._8_56_;
  t = (Tuple3<pbrt::Normal3,_float> *)(in_RDI + 0x18);
  NVar11 = Abs<pbrt::Normal3,float>(t);
  local_38 = NVar11.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar5._0_8_ = NVar11.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  local_40 = vmovlpd_avx(auVar5._0_16_);
  local_30 = local_40;
  local_28 = local_38;
  VVar12 = Point3fi::Error(in_stack_ffffffffffffff10);
  local_58 = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  local_60 = vmovlpd_avx(auVar6._0_16_);
  local_50 = local_60;
  local_48 = local_58;
  tVar3 = Dot<float>((Normal3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                     ,(Vector3<float> *)in_stack_fffffffffffffee8);
  fVar4 = (float)((ulong)local_78 >> 0x20);
  local_24 = tVar3;
  Vector3<float>::Vector3<float>
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  auVar10 = (undefined1  [56])0x0;
  VVar13 = pbrt::operator*(fVar4,(Tuple3<pbrt::Vector3,_float> *)
                                 CONCAT44(tVar3,in_stack_ffffffffffffff08));
  local_88.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar10;
  local_88._0_8_ = vmovlpd_avx(auVar7._0_16_);
  local_6c._0_8_ = local_88._0_8_;
  local_6c.z = local_88.z;
  tVar3 = Dot<float>((Vector3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                     ,in_stack_fffffffffffffee8);
  auVar10 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  if (tVar3 < 0.0) {
    VVar13 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_a0 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    local_b4._12_8_ = vmovlpd_avx(auVar8._0_16_);
    local_94._0_8_ = local_b4._12_8_;
    local_94.z = local_a0;
    local_6c._0_8_ = local_b4._12_8_;
    local_6c.z = local_a0;
  }
  p = (Point3<pbrt::Interval<float>_> *)local_b4;
  Point3<float>::Point3<pbrt::Interval<float>>((Point3<float> *)t,p);
  PVar14 = Point3<float>::operator+((Point3<float> *)t,(Vector3<float> *)p);
  local_c.z = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  local_c._0_8_ = vmovlpd_avx(auVar9._0_16_);
  for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
    pfVar2 = Tuple3<pbrt::Vector3,_float>::operator[](&local_6c,local_cc);
    if (*pfVar2 <= 0.0) {
      pfVar2 = Tuple3<pbrt::Vector3,_float>::operator[](&local_6c,local_cc);
      if (*pfVar2 < 0.0) {
        Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_cc);
        in_stack_fffffffffffffef0 = NextFloatDown(in_stack_fffffffffffffef0);
        pfVar2 = Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_cc);
        *pfVar2 = in_stack_fffffffffffffef0;
      }
    }
    else {
      Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_cc);
      fVar4 = NextFloatUp(in_stack_fffffffffffffef0);
      pfVar2 = Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_cc);
      *pfVar2 = fVar4;
    }
  }
  TVar1.z = local_c.z;
  TVar1.x = local_c.x;
  TVar1.y = local_c.y;
  return (Point3f)TVar1;
}

Assistant:

PBRT_CPU_GPU inline Point3f ShapeSampleContext::OffsetRayOrigin(const Vector3f &w) const {
    // Find vector _offset_ to corner of error bounds and compute initial _po_
    Float d = Dot(Abs(n), pi.Error());
    Vector3f offset = d * Vector3f(n);
    if (Dot(w, n) < 0)
        offset = -offset;
    Point3f po = Point3f(pi) + offset;

    // Round offset point _po_ away from _p_
    for (int i = 0; i < 3; ++i) {
        if (offset[i] > 0)
            po[i] = NextFloatUp(po[i]);
        else if (offset[i] < 0)
            po[i] = NextFloatDown(po[i]);
    }

    return po;
}